

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xml_node::child_value(xml_node *this)

{
  char_t *pcVar1;
  bool bVar2;
  char_t *ivalue;
  xml_node_struct *i;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    this_local = (xml_node *)0x2dd03e;
  }
  else if ((((uint)this->_root->header & 0xf) == 2) && (this->_root->value != (char_t *)0x0)) {
    this_local = (xml_node *)this->_root->value;
  }
  else {
    for (ivalue = (char_t *)this->_root->first_child; ivalue != (char_t *)0x0;
        ivalue = *(char_t **)(ivalue + 0x30)) {
      pcVar1 = *(char_t **)(ivalue + 0x10);
      bVar2 = impl::anon_unknown_0::is_text_node((xml_node_struct *)ivalue);
      if ((bVar2) && (pcVar1 != (char_t *)0x0)) {
        return pcVar1;
      }
    }
    this_local = (xml_node *)0x2dd03e;
  }
  return (char_t *)this_local;
}

Assistant:

PUGI_IMPL_FN const char_t* xml_node::child_value() const
	{
		if (!_root) return PUGIXML_TEXT("");

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI_IMPL_NODETYPE(_root) == node_element && _root->value)
			return _root->value;

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* ivalue = i->value;
			if (impl::is_text_node(i) && ivalue)
				return ivalue;
		}

		return PUGIXML_TEXT("");
	}